

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

void Ssw_StrSimMatchingExtendOne(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  int *piVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Obj_t **ppAVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  
  vNodes->nSize = 0;
  Aig_ManIncrementTravId(p);
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    uVar11 = 0xffffffff;
    lVar12 = 0;
    do {
      piVar1 = (int *)pVVar3->pArray[lVar12];
      if (((piVar1 != (int *)0x0) &&
          (uVar2 = (uint)*(undefined8 *)(piVar1 + 6) & 7, uVar2 == 2 || uVar2 - 5 < 2)) &&
         ((ppAVar5 = p->pReprs, ppAVar5 == (Aig_Obj_t **)0x0 ||
          (ppAVar5[piVar1[9]] == (Aig_Obj_t *)0x0)))) {
        if ((uVar2 == 2) && (p->nTruePis <= *piVar1)) {
          uVar7 = (*piVar1 - p->nTruePis) + p->nTruePos;
          if (((int)uVar7 < 0) || (p->vCos->nSize <= (int)uVar7)) {
LAB_006f7139:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if ((((ppAVar5 != (Aig_Obj_t **)0x0) &&
               (pvVar9 = (void *)(*(ulong *)((long)p->vCos->pArray[uVar7] + 8) & 0xfffffffffffffffe)
               , ppAVar5[*(int *)((long)pvVar9 + 0x24)] != (Aig_Obj_t *)0x0)) &&
              (*(int *)((long)pvVar9 + 0x20) != p->nTravIds)) &&
             ((*(uint *)((long)pvVar9 + 0x18) & 7) != 1)) {
            *(int *)((long)pvVar9 + 0x20) = p->nTravIds;
            uVar2 = vNodes->nSize;
            if (uVar2 == vNodes->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar4 = vNodes->pArray;
            }
            iVar8 = vNodes->nSize;
            vNodes->nSize = iVar8 + 1;
            ppvVar4[iVar8] = pvVar9;
            uVar2 = piVar1[6] & 7;
          }
        }
        if ((0xfffffffd < uVar2 - 7) && (ppAVar5 = p->pReprs, ppAVar5 != (Aig_Obj_t **)0x0)) {
          pvVar9 = (void *)(*(ulong *)(piVar1 + 2) & 0xfffffffffffffffe);
          if ((ppAVar5[*(int *)((long)pvVar9 + 0x24)] != (Aig_Obj_t *)0x0) &&
             (*(int *)((long)pvVar9 + 0x20) != p->nTravIds)) {
            *(int *)((long)pvVar9 + 0x20) = p->nTravIds;
            uVar2 = vNodes->nSize;
            if (uVar2 == vNodes->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar4 = vNodes->pArray;
            }
            iVar8 = vNodes->nSize;
            vNodes->nSize = iVar8 + 1;
            ppvVar4[iVar8] = pvVar9;
            ppAVar5 = p->pReprs;
            if (ppAVar5 == (Aig_Obj_t **)0x0) goto LAB_006f6f79;
          }
          pvVar9 = (void *)(*(ulong *)(piVar1 + 4) & 0xfffffffffffffffe);
          if ((ppAVar5[*(int *)((long)pvVar9 + 0x24)] != (Aig_Obj_t *)0x0) &&
             (*(int *)((long)pvVar9 + 0x20) != p->nTravIds)) {
            *(int *)((long)pvVar9 + 0x20) = p->nTravIds;
            uVar2 = vNodes->nSize;
            if (uVar2 == vNodes->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
                }
                vNodes->pArray = ppvVar4;
                vNodes->nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar4 = vNodes->pArray;
            }
            iVar8 = vNodes->nSize;
            vNodes->nSize = iVar8 + 1;
            ppvVar4[iVar8] = pvVar9;
          }
        }
LAB_006f6f79:
        if (p->pFanData == (int *)0x0) {
          __assert_fail("p->pFanData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                        ,0x2f4,"void Ssw_StrSimMatchingExtendOne(Aig_Man_t *, Vec_Ptr_t *)");
        }
        uVar6 = *(ulong *)(piVar1 + 6);
        if ((uVar6 & 0xffffffc0) != 0) {
          uVar2 = 0;
          do {
            if (uVar2 == 0) {
              if (p->nFansAlloc <= piVar1[9]) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar8 = piVar1[9] * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar11 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar8 = (uVar11 & 1) + ((int)uVar11 >> 1) * 5 + 3;
            }
            pVVar3 = p->vObjs;
            uVar11 = p->pFanData[iVar8];
            if (pVVar3 == (Vec_Ptr_t *)0x0) {
              piVar10 = (int *)0x0;
            }
            else {
              uVar7 = (int)uVar11 >> 1;
              if (((int)uVar7 < 0) || (pVVar3->nSize <= (int)uVar7)) goto LAB_006f7139;
              piVar10 = (int *)pVVar3->pArray[uVar7];
            }
            if ((piVar10[6] & 7U) == 3) {
              if (p->nTruePos <= *piVar10) {
                uVar7 = (*piVar10 - p->nTruePos) + p->nTruePis;
                if ((-1 < (int)uVar7) && ((int)uVar7 < p->vCis->nSize)) {
                  piVar10 = (int *)p->vCis->pArray[uVar7];
                  goto LAB_006f704b;
                }
                goto LAB_006f7139;
              }
            }
            else {
LAB_006f704b:
              if (((p->pReprs != (Aig_Obj_t **)0x0) && (p->pReprs[piVar10[9]] != (Aig_Obj_t *)0x0))
                 && (piVar10[8] != p->nTravIds)) {
                piVar10[8] = p->nTravIds;
                uVar7 = vNodes->nSize;
                if (uVar7 == vNodes->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (vNodes->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
                    }
                    vNodes->pArray = ppvVar4;
                    vNodes->nCap = 0x10;
                  }
                  else {
                    if (vNodes->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar7 << 4);
                    }
                    vNodes->pArray = ppvVar4;
                    vNodes->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar4 = vNodes->pArray;
                }
                iVar8 = vNodes->nSize;
                vNodes->nSize = iVar8 + 1;
                ppvVar4[iVar8] = piVar10;
                uVar6 = *(ulong *)(piVar1 + 6);
              }
            }
            uVar2 = uVar2 + 1;
          } while (uVar2 < ((uint)(uVar6 >> 6) & 0x3ffffff));
        }
      }
      lVar12 = lVar12 + 1;
      pVVar3 = p->vObjs;
    } while (lVar12 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Ssw_StrSimMatchingExtendOne( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pNext, * pObj;
    int i, k, iFan = -1;
    Vec_PtrClear( vNodes );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Aig_ObjRepr( p, pObj ) != NULL )
            continue;
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pNext = Saig_ObjLoToLi(p, pObj);
            pNext = Aig_ObjFanin0(pNext);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) && !Aig_ObjIsConst1(pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( Aig_ObjRepr( p, pNext )&& !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        Aig_ObjForEachFanout( p, pObj, pNext, iFan, k )
        {
            if ( Saig_ObjIsPo(p, pNext) )
                continue;
            if ( Saig_ObjIsLi(p, pNext) )
                pNext = Saig_ObjLiToLo(p, pNext);
            if ( Aig_ObjRepr( p, pNext ) && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
    }
}